

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O2

char * __thiscall
QNetworkReplyImplPrivate::getDownloadBuffer(QNetworkReplyImplPrivate *this,qint64 size)

{
  QNetworkReply *this_00;
  long lVar1;
  PrivateShared *pPVar2;
  char *pcVar3;
  QSharedPointer<char> *value;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined8 local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = this->downloadBuffer;
  if (pcVar3 == (char *)0x0) {
    this_00 = *(QNetworkReply **)&(this->super_QNetworkReplyPrivate).field_0x8;
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78.shared = (PrivateShared *)0x0;
    local_78._8_8_ = (Data *)0x0;
    local_78._16_8_ = 0;
    local_60 = 2;
    QNetworkRequest::attribute
              ((QVariant *)&local_58,&(this->super_QNetworkReplyPrivate).request,
               MaximumDownloadBufferSizeAttribute,(QVariant *)&local_78);
    QVariant::~QVariant((QVariant *)&local_78);
    if ((undefined1 *)0x3 < puStack_40) {
      lVar1 = QVariant::toLongLong((bool *)local_58.data);
      if (size <= lVar1) {
        this->downloadBufferCurrentSize = 0;
        this->downloadBufferMaximumSize = size;
        pPVar2 = (PrivateShared *)operator_new__(size);
        this->downloadBuffer = (char *)pPVar2;
        local_78.shared = pPVar2;
        local_78._8_8_ = operator_new(0x20);
        ((Data *)(local_78._8_8_ + 0x10))->destroyer = (DestroyerFn)pPVar2;
        ((Data *)local_78._8_8_)->destroyer =
             QtSharedPointer::
             ExternalRefCountWithCustomDeleter<char,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/access/qnetworkreplyimpl.cpp:539:74)>
             ::deleter;
        (((Data *)local_78._8_8_)->strongref)._q_value.super___atomic_base<int>._M_i = 1;
        (((Data *)local_78._8_8_)->weakref)._q_value.super___atomic_base<int>._M_i = 1;
        QSharedPointer<char>::operator=
                  (&this->downloadBufferPointer,(QSharedPointer<char> *)&local_78);
        QSharedPointer<char>::deref((Data *)local_78._8_8_);
        QVariant::fromValue<QSharedPointer<char>>
                  ((enable_if_t<std::is_copy_constructible_v<QSharedPointer<char>_>_&&_std::is_destructible_v<QSharedPointer<char>_>,_QVariant>
                    *)&local_78,(QVariant *)&this->downloadBufferPointer,value);
        QNetworkReply::setAttribute(this_00,DownloadBufferAttribute,(QVariant *)&local_78);
        QVariant::~QVariant((QVariant *)&local_78);
      }
    }
    QVariant::~QVariant((QVariant *)&local_58);
    pcVar3 = this->downloadBuffer;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pcVar3;
  }
  __stack_chk_fail();
}

Assistant:

char* QNetworkReplyImplPrivate::getDownloadBuffer(qint64 size)
{
    Q_Q(QNetworkReplyImpl);

    if (!downloadBuffer) {
        // We are requested to create it
        // Check attribute() if allocating a buffer of that size can be allowed
        QVariant bufferAllocationPolicy = request.attribute(QNetworkRequest::MaximumDownloadBufferSizeAttribute);
        if (bufferAllocationPolicy.isValid() && bufferAllocationPolicy.toLongLong() >= size) {
            downloadBufferCurrentSize = 0;
            downloadBufferMaximumSize = size;
            downloadBuffer = new char[downloadBufferMaximumSize]; // throws if allocation fails
            downloadBufferPointer = QSharedPointer<char>(downloadBuffer, [](auto p) { delete[] p; });

            q->setAttribute(QNetworkRequest::DownloadBufferAttribute, QVariant::fromValue<QSharedPointer<char> > (downloadBufferPointer));
        }
    }

    return downloadBuffer;
}